

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

double __thiscall
chrono::fea::ChElementShellANCF_3833::GetVonMissesStress
          (ChElementShellANCF_3833 *this,double layer,double xi,double eta,double layer_zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChElementShellANCF_3833 *this_00;
  long lVar11;
  ChElementShellANCF_3833 *this_01;
  ResScalar RVar12;
  ResScalar RVar13;
  ResScalar RVar14;
  ResScalar RVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar16;
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChVectorN<double,_6> epsilon_combined;
  ChMatrixNM<double,_3,_3> SPK2;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> S;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  double local_990;
  double local_988;
  double local_980;
  ResScalar local_978;
  ResScalar local_970;
  ResScalar local_968;
  double local_958;
  ResScalar local_950;
  ChElementShellANCF_3833 *local_948;
  long local_940;
  undefined1 local_938 [8];
  undefined1 local_930 [64];
  undefined1 local_8f0 [16];
  ChLoadableUVW local_8e0;
  variable_if_dynamic<long,__1> vStack_8d8;
  variable_if_dynamic<long,__1> local_8d0;
  pointer psStack_8c8;
  pointer local_8b8;
  Matrix<double,_3,_3,_0,_3,_3> local_8b0;
  undefined1 local_868 [32];
  variable_if_dynamic<long,__1> local_848;
  ulong local_840;
  double local_838;
  double local_828;
  undefined1 local_820 [16];
  Matrix<double,_3,_3,_0,_3,_3> *local_810;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_7f0;
  undefined1 local_7c0 [632];
  Matrix<double,_3,_3,_1,_3,_3> local_548;
  Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_500 [36];
  MatrixNx3c local_2c0;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_930._8_8_ = local_930._0_8_;
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = layer;
  lVar11 = vcvttsd2usi_avx512f(auVar23._0_16_);
  local_940 = lVar11 * 0x20;
  dVar16 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar11].m_thickness;
  Calc_Sxi_D(this,&local_2c0,xi,eta,layer_zeta,dVar16,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11] - this->m_thicknessZ * 0.5) +
             dVar16 * 0.5 + this->m_midsurfoffset);
  local_500[0].m_lhs = (LhsNested)&this->m_ebar0;
  local_948 = this;
  local_7c0._0_8_ = &local_548;
  local_500[0].m_rhs.m_xpr = (XprTypeNested)&local_2c0;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_7c0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
              *)local_500);
  local_500[0].m_lhs = &local_2c0;
  local_500[0].m_rhs.m_xpr = &local_548;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_2c0,local_500);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_7c0._0_8_ = local_500;
  local_7c0._8_8_ = &local_2c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_8b0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
              *)local_7c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,0);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_7c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_938);
  dVar16 = (RVar12 + -1.0) * 0.5;
  local_990 = dVar16;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,1);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_7c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_938);
  dVar7 = (RVar12 + -1.0) * 0.5;
  local_988 = dVar7;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,2);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_7c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_938);
  dVar8 = (RVar12 + -1.0) * 0.5;
  local_980 = dVar8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,2);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_7c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_938);
  local_978 = RVar12;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,2);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_7c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_938);
  local_970 = RVar13;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_7c0,&local_8b0,0);
  this_00 = local_948;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_938,&local_8b0,1);
  local_968 = Eigen::internal::
              dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
              ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    local_7c0,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    local_938);
  if (this_00->m_damping_enabled == true) {
    local_950 = local_968;
    CalcCoordDerivMatrix(this_00,(Matrix3xN *)local_7c0);
    local_868._8_8_ = &local_2c0;
    local_868._0_8_ =
         (BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)local_7c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_938,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
                *)local_868);
    local_958 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,0);
    auVar24._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_868,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_8f0);
    auVar24._8_56_ = extraout_var;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_958;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar16;
    auVar1 = vfmadd213sd_fma(auVar24._0_16_,auVar27,auVar1);
    local_990 = auVar1._0_8_;
    dVar16 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,1);
    auVar25._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_868,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_8f0);
    auVar25._8_56_ = extraout_var_00;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar16;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar7;
    auVar1 = vfmadd213sd_fma(auVar25._0_16_,auVar28,auVar2);
    local_988 = auVar1._0_8_;
    dVar16 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,2);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,2);
    auVar26._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_868,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_8f0);
    auVar26._8_56_ = extraout_var_01;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar16;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar8;
    auVar1 = vfmadd213sd_fma(auVar26._0_16_,auVar29,auVar3);
    local_980 = auVar1._0_8_;
    dVar16 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,2);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_868,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_8f0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_7f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_820,&local_8b0,2);
    RVar15 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_7f0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_820);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar16;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = RVar12;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = RVar15 + RVar14;
    auVar1 = vfmadd213sd_fma(auVar17,auVar30,auVar4);
    local_978 = auVar1._0_8_;
    dVar16 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,2);
    RVar12 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_868,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_8f0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_7f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_820,&local_8b0,2);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_7f0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_820);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar16;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = RVar13;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = RVar14 + RVar12;
    auVar1 = vfmadd213sd_fma(auVar18,auVar31,auVar5);
    local_970 = auVar1._0_8_;
    dVar16 = this_00->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_868,&local_8b0,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_8f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,1);
    RVar12 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_868,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_8f0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_7f0,(Matrix<double,_3,_3,_0,_3,_3> *)local_938,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_820,&local_8b0,1);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_7f0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_820);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar16;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_950;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = RVar13 + RVar12;
    auVar1 = vfmadd213sd_fma(auVar19,auVar32,auVar6);
    local_968 = auVar1._0_8_;
  }
  lVar11 = local_940;
  std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)local_938
             ,(__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((this_00->m_layers).
                        super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_material).
                      super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + local_940));
  memcpy((element_type *)local_7c0,(ChMatrixNM<double,_6,_6> *)((long)local_938 + 0x20),0x120);
  this_01 = (ChElementShellANCF_3833 *)local_930;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
  RotateReorderStiffnessMatrix
            (this_01,(ChMatrixNM<double,_6,_6> *)local_7c0,
             *(double *)
              ((long)&((this_00->m_layers).
                       super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar11));
  local_930._0_8_ = &local_990;
  local_938 = (undefined1  [8])local_7c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_8f0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)local_938);
  auVar10._8_8_ = psStack_8c8;
  auVar10._0_8_ = local_8d0.m_value;
  auVar35._8_8_ = local_8e0;
  auVar35._0_8_ = local_8e0;
  auVar35._16_8_ = local_8e0;
  auVar35._24_8_ = local_8e0;
  local_820._0_8_ = &local_8b0;
  local_938 = (undefined1  [8])local_8f0._0_8_;
  auVar9._8_8_ = local_8d0.m_value;
  auVar9._0_8_ = vStack_8d8.m_value;
  local_930._24_8_ = local_8f0._8_8_;
  auVar1 = vunpcklpd_avx(auVar9,auVar10);
  auVar35 = vblendpd_avx(ZEXT1632(auVar1),auVar35,8);
  local_930._32_32_ = vpermpd_avx2(auVar35,0xc4);
  local_930._0_16_ = vshufpd_avx(auVar10,auVar10,1);
  local_930._16_8_ = psStack_8c8;
  local_820._8_8_ =
       (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
        *)local_938;
  local_810 = (Matrix<double,_3,_3,_0,_3,_3> *)local_820._0_8_;
  local_8b8 = (pointer)Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)local_820._0_8_);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&local_7f0,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
               *)local_820,(double *)&local_8b8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_868,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_7f0);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_868._8_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = ((double)local_848.m_value - local_828) * ((double)local_848.m_value - local_828);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (double)local_868._0_8_ - (double)local_848.m_value;
  auVar1 = vfmadd231sd_fma(auVar20,auVar36,auVar36);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_828 - (double)local_868._0_8_;
  auVar1 = vfmadd213sd_fma(auVar33,auVar33,auVar1);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_840;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_838 * local_838;
  auVar2 = vfmadd231sd_fma(auVar37,auVar21,auVar21);
  auVar2 = vfmadd231sd_fma(auVar2,auVar34,auVar34);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar2._0_8_ * 3.0;
  auVar1 = vfmadd231sd_fma(auVar22,auVar1,ZEXT816(0x3fe0000000000000));
  if (auVar1._0_8_ < 0.0) {
    dVar16 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar16 = auVar1._0_8_;
  }
  return dVar16;
}

Assistant:

double ChElementShellANCF_3833::GetVonMissesStress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}